

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_page_manager.h
# Opt level: O1

Region * __thiscall
density::detail::SystemPageManager<65536UL>::get_next_region
          (SystemPageManager<65536UL> *this,progress_guarantee i_progress_guarantee,
          Region *i_curr_region,Region **io_new_region)

{
  Region *pRVar1;
  Region *pRVar2;
  Region *pRVar3;
  bool bVar4;
  
  pRVar1 = (i_curr_region->m_next_region)._M_b._M_p;
  pRVar3 = pRVar1;
  if (pRVar1 == (Region *)0x0) {
    if (i_progress_guarantee != progress_blocking) {
      return (Region *)0x0;
    }
    if (*io_new_region == (Region *)0x0) {
      pRVar3 = create_region();
      *io_new_region = pRVar3;
    }
    pRVar3 = *io_new_region;
    if (pRVar3 == (Region *)0x0) {
      pRVar3 = (i_curr_region->m_next_region)._M_b._M_p;
      if (pRVar3 == (Region *)0x0) {
        return (Region *)0x0;
      }
    }
    else {
      pRVar2 = *io_new_region;
      pRVar2->m_cumulative_available_memory =
           (pRVar3->m_end - (pRVar3->m_curr).super___atomic_base<unsigned_long>._M_i) +
           i_curr_region->m_cumulative_available_memory;
      LOCK();
      pRVar3 = (i_curr_region->m_next_region)._M_b._M_p;
      bVar4 = pRVar3 == (Region *)0x0;
      if (bVar4) {
        (i_curr_region->m_next_region)._M_b._M_p = pRVar2;
        pRVar3 = pRVar1;
      }
      UNLOCK();
      if (bVar4) {
        pRVar3 = *io_new_region;
        *io_new_region = (Region *)0x0;
      }
    }
  }
  LOCK();
  if (i_curr_region == (this->m_curr_region)._M_b._M_p) {
    (this->m_curr_region)._M_b._M_p = pRVar3;
  }
  UNLOCK();
  return pRVar3;
}

Assistant:

Region * get_next_region(
              progress_guarantee i_progress_guarantee,
              Region *           i_curr_region,
              Region **          io_new_region) noexcept
            {
                // we get the pointer to the next_region region, or allocate it
                auto next_region = i_curr_region->m_next_region.load();
                if (next_region == nullptr)
                {
                    // check if the user want to allocate memory from the system
                    if (i_progress_guarantee != progress_blocking)
                    {
                        return nullptr;
                    }

                    // allocate a new region, if we don't have one already
                    if (*io_new_region == nullptr)
                    {
                        *io_new_region = create_region();
                    }

                    if (*io_new_region != nullptr)
                    {
                        // set m_cumulative_available_memory on the new region
                        auto const new_region_size =
                          (*io_new_region)->m_end - (*io_new_region)->m_curr;
                        DENSITY_ASSUME_UINT_ALIGNED(new_region_size, page_alignment_and_size);
                        (*io_new_region)->m_cumulative_available_memory =
                          i_curr_region->m_cumulative_available_memory + new_region_size;

                        // The allocation succeeded, so set the pointer to the next_region region, if it is null
                        if (i_curr_region->m_next_region.compare_exchange_strong(
                              next_region, *io_new_region))
                        {
                            next_region    = *io_new_region;
                            *io_new_region = nullptr;
                        }
                    }
                    else
                    {
                        /* We couldn't allocate a new region, check if someone else could in the meanwhile.
                            If not, we give in. Else we continue the loop. */
                        next_region = i_curr_region->m_next_region.load();
                        if (next_region == nullptr)
                        {
                            // allocation failed
                            return nullptr;
                        }
                    }
                }

                /* try to update m_curr_region (if m_curr_region == i_curr_region, then m_curr_region = next_region).
                    This operation is not mandatory, so we can tolerate spurious failures. */
                DENSITY_ASSUME(next_region != nullptr);
                auto expected = i_curr_region;
                m_curr_region.compare_exchange_weak(
                  expected, next_region, std::memory_order_release, std::memory_order_relaxed);

                // we are done we this region
                i_curr_region = next_region;

                return i_curr_region;
            }